

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Accuracy::Texture2DMipmapCase::init(Texture2DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  pointer pPVar1;
  uint uVar2;
  int iVar3;
  uint extraout_EAX;
  uint uVar4;
  Texture2D *this_01;
  long lVar5;
  deUint32 step;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((char)iVar3 == '\0') {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Warning: High precision not supported in fragment shaders.",0x3a)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  this_01 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height)
  ;
  this->m_texture = this_01;
  uVar4 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar4 = this->m_width;
  }
  if (uVar4 != 0) {
    uVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    lVar5 = 0;
    iVar3 = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,iVar3);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)local_1b0);
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar5 + -8),
                 (Vec4 *)local_1b0);
      iVar3 = iVar3 + 1;
      lVar5 = lVar5 + 0x28;
      uVar4 = extraout_EAX;
    } while ((ulong)((uVar2 ^ 0xffffffe0) + 0x21) * 0x28 != lVar5);
  }
  return uVar4;
}

Assistant:

void Texture2DMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

	int numLevels = deLog2Floor32(de::max(m_width, m_height))+1;

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}